

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O2

int countSelected(atom *theAtoms,int srcFlag)

{
  int ns;
  
  ns = 0;
  for (; theAtoms != (atom *)0x0; theAtoms = theAtoms->next) {
    ns = (ns + 1) - (uint)((theAtoms->flags & srcFlag) == 0);
  }
  return ns;
}

Assistant:

int countSelected(atom *theAtoms, int srcFlag)
{
   atom *a = NULL;
   int ns = 0;
   for(a = theAtoms; a; a = a->next) {
      if (a->flags & srcFlag) { ns++; }
   }
   return ns;
}